

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sit.c
# Opt level: O0

void rndcurse(void)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  obj *otmp_00;
  char *pcVar5;
  bool local_12b;
  bool local_12a;
  bool local_129;
  char local_128 [8];
  char Your_buf [256];
  obj *local_20;
  obj *otmp;
  int local_10;
  int onum;
  int cnt;
  int nobj;
  
  onum = 0;
  if (((uwep == (obj *)0x0) || (uwep->oartifact != '\n')) || (iVar2 = rn2(0x14), iVar2 == 0)) {
    if ((u.uprops[0x2c].extrinsic != 0) ||
       ((u.umonnum != u.umonster && (bVar1 = resists_magm(&youmonst), bVar1 != '\0')))) {
      shieldeff(u.ux,u.uy);
      pline("You feel a malignant aura surround %s.","you");
    }
    for (local_20 = invent; local_20 != (obj *)0x0; local_20 = local_20->nobj) {
      if (local_20->oclass != '\f') {
        onum = onum + 1;
      }
    }
    if (onum != 0) {
      local_129 = true;
      if (u.uprops[0x2c].extrinsic == 0) {
        local_12a = false;
        if (u.umonnum != u.umonster) {
          bVar1 = resists_magm(&youmonst);
          local_12a = bVar1 != '\0';
        }
        local_129 = local_12a;
      }
      local_12b = u.uprops[0x32].intrinsic != 0 || u.uprops[0x32].extrinsic != 0;
      for (local_10 = rnd((int)(6 / (ulong)(long)(int)((uint)local_129 + (uint)local_12b + 1)));
          0 < local_10; local_10 = local_10 + -1) {
        otmp._4_4_ = rnd(onum);
        local_20 = invent;
        while ((local_20 != (obj *)0x0 &&
               ((local_20->oclass == '\f' || (otmp._4_4_ = otmp._4_4_ + -1, otmp._4_4_ != 0))))) {
          local_20 = local_20->nobj;
        }
        if ((local_20 != (obj *)0x0) && ((*(uint *)&local_20->field_0x4a & 1) == 0)) {
          if ((local_20->oartifact == '\0') ||
             ((bVar1 = spec_ability(local_20,4), bVar1 == '\0' || (iVar2 = rn2(10), 7 < iVar2)))) {
            if (((u.uprops[0x1e].intrinsic == 0) &&
                (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                 (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
               ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
              Shk_Your(local_128,local_20);
            }
            if ((*(uint *)&local_20->field_0x4a >> 1 & 1) == 0) {
              if ((flags.verbose != '\0') &&
                 ((((u.uprops[0x1e].intrinsic == 0 &&
                    ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                   (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                  ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
                pcVar3 = aobjnam(local_20,"glow");
                pcVar4 = hcolor("black");
                pcVar4 = an(pcVar4);
                pline("%s %s with %s aura.",local_128,pcVar3,pcVar4);
              }
              curse(local_20);
            }
            else {
              if ((flags.verbose != '\0') &&
                 (((u.uprops[0x1e].intrinsic == 0 &&
                   (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                    (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                  ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
                pcVar3 = aobjnam(local_20,"glow");
                pcVar4 = hcolor("brown");
                pline("%s %s %s.",local_128,pcVar3,pcVar4);
              }
              unbless(local_20);
            }
            *(uint *)&local_20->field_0x4a = *(uint *)&local_20->field_0x4a & 0xffffffbf | 0x40;
          }
          else {
            pcVar3 = Tobjnam(local_20,"resist");
            pline("%s!",pcVar3);
          }
        }
      }
      update_inventory();
    }
    if (((u.usteed != (monst *)0x0) && (iVar2 = rn2(4), iVar2 == 0)) &&
       ((otmp_00 = which_armor(u.usteed,0x100000), otmp_00 != (obj *)0x0 &&
        ((*(uint *)&otmp_00->field_0x4a & 1) == 0)))) {
      if ((*(uint *)&otmp_00->field_0x4a >> 1 & 1) == 0) {
        curse(otmp_00);
      }
      else {
        unbless(otmp_00);
      }
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        pcVar3 = y_monnam(u.usteed);
        pcVar3 = upstart(pcVar3);
        pcVar3 = s_suffix(pcVar3);
        pcVar4 = aobjnam(otmp_00,"glow");
        pcVar5 = "brown";
        if ((*(uint *)&otmp_00->field_0x4a & 1) != 0) {
          pcVar5 = "black";
        }
        pcVar5 = hcolor(pcVar5);
        pline("%s %s %s.",pcVar3,pcVar4,pcVar5);
        *(uint *)&otmp_00->field_0x4a = *(uint *)&otmp_00->field_0x4a & 0xffffffbf | 0x40;
      }
    }
  }
  else {
    pline("You feel a malignant aura surround %s.","the magic-absorbing blade");
  }
  return;
}

Assistant:

void rndcurse(void)
{
	int	nobj = 0;
	int	cnt, onum;
	struct	obj	*otmp;
	static const char mal_aura[] = "You feel a malignant aura surround %s.";

	if (uwep && (uwep->oartifact == ART_MAGICBANE) && rn2(20)) {
	    pline(mal_aura, "the magic-absorbing blade");
	    return;
	}

	if (Antimagic) {
	    shieldeff(u.ux, u.uy);
	    pline(mal_aura, "you");
	}

	for (otmp = invent; otmp; otmp = otmp->nobj) {
	    /* gold isn't subject to being cursed or blessed */
	    if (otmp->oclass == COIN_CLASS) continue;
	    nobj++;
	}
	if (nobj) {
	    for (cnt = rnd(6/((!!Antimagic) + (!!Half_spell_damage) + 1));
		 cnt > 0; cnt--)  {
		char Your_buf[BUFSZ];

		onum = rnd(nobj);
		for (otmp = invent; otmp; otmp = otmp->nobj) {
		    /* as above */
		    if (otmp->oclass == COIN_CLASS) continue;
		    if (--onum == 0) break;	/* found the target */
		}
		/* the !otmp case should never happen; picking an already
		   cursed item happens--avoid "resists" message in that case */
		if (!otmp || otmp->cursed) continue;	/* next target */

		if (otmp->oartifact && spec_ability(otmp, SPFX_INTEL) &&
		   rn2(10) < 8) {
		    pline("%s!", Tobjnam(otmp, "resist"));
		    continue;
		}

		if (!Blind) Shk_Your(Your_buf, otmp);
		if (otmp->blessed) {
		    if (flags.verbose && !Blind) {
			pline("%s %s %s.",
			      Your_buf,
			      aobjnam(otmp, "glow"),
			      hcolor("brown"));
		    }
		    unbless(otmp);
		} else {
		    if (flags.verbose && !Blind) {
			pline("%s %s with %s aura.",
			      Your_buf,
			      aobjnam(otmp, "glow"),
			      an(hcolor("black")));
		    }
		    curse(otmp);
		}
		otmp->bknown = TRUE;
	    }
	    update_inventory();
	}

	/* treat steed's saddle as extended part of hero's inventory */
	if (u.usteed && !rn2(4) &&
		(otmp = which_armor(u.usteed, W_SADDLE)) != 0 &&
		!otmp->cursed) {	/* skip if already cursed */
	    if (otmp->blessed)
		unbless(otmp);
	    else
		curse(otmp);
	    if (!Blind) {
		pline("%s %s %s.",
		      s_suffix(upstart(y_monnam(u.usteed))),
		      aobjnam(otmp, "glow"),
		      hcolor(otmp->cursed ? "black" : "brown"));
		otmp->bknown = TRUE;
	    }
	}
}